

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O1

PClassActor * FState::StaticFindStateOwner(FState *state,PClassActor *info)

{
  if (info == (PClassActor *)0x0) {
    return (PClassActor *)0x0;
  }
  while ((state < info->OwnedStates || (info->OwnedStates + info->NumOwnedStates <= state))) {
    info = dyn_cast<PClassActor>((DObject *)(info->super_PClass).ParentClass);
    if (info == (PClassActor *)0x0) {
      return (PClassActor *)0x0;
    }
  }
  return info;
}

Assistant:

PClassActor *FState::StaticFindStateOwner (const FState *state, PClassActor *info)
{
	while (info != NULL)
	{
		if (state >= info->OwnedStates &&
			state <  info->OwnedStates + info->NumOwnedStates)
		{
			return info;
		}
		info = dyn_cast<PClassActor>(info->ParentClass);
	}
	return NULL;
}